

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

int message_add_body_amqp_sequence(MESSAGE_HANDLE message,AMQP_VALUE sequence_list)

{
  size_t sVar1;
  MESSAGE_BODY_TYPE MVar2;
  LOGGER_LOG p_Var3;
  ulong uVar4;
  AMQP_VALUE *ppAVar5;
  AMQP_VALUE pAVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  
  if (message == (MESSAGE_HANDLE)0x0 || sequence_list == (AMQP_VALUE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x4fa;
    }
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
              ,"message_add_body_amqp_sequence",0x4f9,1,
              "Bad arguments: message = %p, sequence_list = %p",message,sequence_list);
    return 0x4fa;
  }
  MVar2 = internal_get_body_type(message);
  if ((MVar2 == MESSAGE_BODY_TYPE_VALUE) || (MVar2 == MESSAGE_BODY_TYPE_DATA)) {
    p_Var3 = xlogging_get_log_function();
    iVar8 = 0x504;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x504;
    }
    pcVar10 = "Body is already set to another body type";
    iVar7 = 0x503;
  }
  else {
    uVar4 = message->body_amqp_sequence_count + 1;
    uVar9 = 0xffffffffffffffff;
    if (uVar4 != 0) {
      uVar9 = uVar4;
    }
    if (uVar9 >> 0x3d == 0) {
      ppAVar5 = (AMQP_VALUE *)realloc(message->body_amqp_sequence_items,uVar9 << 3);
      if (ppAVar5 == (AMQP_VALUE *)0x0) {
        p_Var3 = xlogging_get_log_function();
        iVar8 = 0x518;
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return 0x518;
        }
        pcVar10 = "Cannot allocate enough memory for sequence items";
        iVar7 = 0x517;
      }
      else {
        message->body_amqp_sequence_items = ppAVar5;
        pAVar6 = amqpvalue_clone(sequence_list);
        sVar1 = message->body_amqp_sequence_count;
        message->body_amqp_sequence_items[sVar1] = pAVar6;
        if (message->body_amqp_sequence_items[sVar1] != (AMQP_VALUE)0x0) {
          message->body_amqp_sequence_count = sVar1 + 1;
          return 0;
        }
        p_Var3 = xlogging_get_log_function();
        iVar8 = 0x525;
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return 0x525;
        }
        pcVar10 = "Cloning sequence failed";
        iVar7 = 0x524;
      }
    }
    else {
      p_Var3 = xlogging_get_log_function();
      iVar8 = 0x50e;
      if (p_Var3 == (LOGGER_LOG)0x0) {
        return 0x50e;
      }
      pcVar10 = "Invalid size for new_body_amqp_sequence_items";
      iVar7 = 0x50d;
    }
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c",
            "message_add_body_amqp_sequence",iVar7,1,pcVar10);
  return iVar8;
}

Assistant:

int message_add_body_amqp_sequence(MESSAGE_HANDLE message, AMQP_VALUE sequence_list)
{
    int result;

    if ((message == NULL) ||
        (sequence_list == NULL))
    {
        /* Codes_SRS_MESSAGE_01_112: [ If `message` or `sequence` is NULL, `message_add_body_amqp_sequence` shall fail and return a non-zero value. ]*/
        LogError("Bad arguments: message = %p, sequence_list = %p",
            message, sequence_list);
        result = MU_FAILURE;
    }
    else
    {
        MESSAGE_BODY_TYPE body_type = internal_get_body_type(message);
        if ((body_type == MESSAGE_BODY_TYPE_DATA) ||
            (body_type == MESSAGE_BODY_TYPE_VALUE))
        {
            /* Codes_SRS_MESSAGE_01_115: [ If the body was already set to an AMQP data list or an AMQP value, `message_add_body_amqp_sequence` shall fail and return a non-zero value. ]*/
            LogError("Body is already set to another body type");
            result = MU_FAILURE;
        }
        else
        {
            size_t realloc_size = safe_add_size_t(message->body_amqp_sequence_count, 1);
            realloc_size = safe_multiply_size_t(sizeof(AMQP_VALUE), realloc_size);

            if (realloc_size == SIZE_MAX)
            {
                LogError("Invalid size for new_body_amqp_sequence_items");
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE* new_body_amqp_sequence_items = (AMQP_VALUE*)realloc(message->body_amqp_sequence_items, realloc_size);

                if (new_body_amqp_sequence_items == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_158: [ If allocating memory in order to store the sequence fails, `message_add_body_amqp_sequence` shall fail and return a non-zero value. ]*/
                    LogError("Cannot allocate enough memory for sequence items");
                    result = MU_FAILURE;
                }
                else
                {
                    message->body_amqp_sequence_items = new_body_amqp_sequence_items;

                    /* Codes_SRS_MESSAGE_01_110: [ `message_add_body_amqp_sequence` shall add the contents of `sequence` to the list of AMQP sequences for the body of the message identified by `message`. ]*/
                    /* Codes_SRS_MESSAGE_01_156: [ The AMQP sequence shall be cloned by calling `amqpvalue_clone`. ]*/
                    message->body_amqp_sequence_items[message->body_amqp_sequence_count] = amqpvalue_clone(sequence_list);
                    if (message->body_amqp_sequence_items[message->body_amqp_sequence_count] == NULL)
                    {
                        /* Codes_SRS_MESSAGE_01_157: [ If `amqpvalue_clone` fails, `message_add_body_amqp_sequence` shall fail and return a non-zero value. ]*/
                        LogError("Cloning sequence failed");
                        result = MU_FAILURE;
                    }
                    else
                    {
                        /* Codes_SRS_MESSAGE_01_114: [ If adding the AMQP sequence fails, the previous value shall be preserved. ]*/
                        message->body_amqp_sequence_count++;

                        /* Codes_SRS_MESSAGE_01_111: [ On success it shall return 0. ]*/
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}